

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O1

void __thiscall
icu_63::UnifiedCache::_fetch
          (UnifiedCache *this,UHashElement *element,SharedObject **value,UErrorCode *status)

{
  u_atomic_int32_t *puVar1;
  int iVar2;
  SharedObject *pSVar3;
  
  *status = *(UErrorCode *)((long)(element->key).pointer + 8);
  if (*value != (SharedObject *)0x0) {
    LOCK();
    puVar1 = &(*value)->hardRefCount;
    (puVar1->super___atomic_base<int>)._M_i = (puVar1->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
    if ((puVar1->super___atomic_base<int>)._M_i == 0) {
      this->fNumValuesInUse = this->fNumValuesInUse + -1;
    }
  }
  pSVar3 = (SharedObject *)(element->value).pointer;
  *value = pSVar3;
  if (pSVar3 != (SharedObject *)0x0) {
    LOCK();
    puVar1 = &pSVar3->hardRefCount;
    iVar2 = (puVar1->super___atomic_base<int>)._M_i;
    (puVar1->super___atomic_base<int>)._M_i = (puVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    if (iVar2 == 0) {
      this->fNumValuesInUse = this->fNumValuesInUse + 1;
      return;
    }
  }
  return;
}

Assistant:

void UnifiedCache::_fetch(
        const UHashElement *element,
        const SharedObject *&value,
        UErrorCode &status) const {
    const CacheKeyBase *theKey = (const CacheKeyBase *) element->key.pointer;
    status = theKey->fCreationStatus;

    // Since we have the cache lock, calling regular SharedObject add/removeRef
    // could cause us to deadlock on ourselves since they may need to lock
    // the cache mutex.
    removeHardRef(value);
    value = static_cast<const SharedObject *>(element->value.pointer);
    addHardRef(value);
}